

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall ssl_st::~ssl_st(ssl_st *this)

{
  long lVar1;
  ssl_st *this_local;
  
  CRYPTO_free_ex_data(0x65cab0,this,(CRYPTO_EX_DATA *)&this->s2);
  std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::reset
            ((unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)&this->method,(pointer)0x0);
  lVar1._0_4_ = this->version;
  lVar1._4_4_ = this->type;
  if (lVar1 != 0) {
    (**(code **)(*(long *)this + 0x10))();
  }
  std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<char,_bssl::internal::Deleter> *)&this->read_ahead);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&this->packet_length);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&this->packet);
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&this->init_msg);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&this->bbio);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&this->wbio);
  std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)&this->method);
  return;
}

Assistant:

ssl_st::~ssl_st() {
  CRYPTO_free_ex_data(&g_ex_data_class_ssl, this, &ex_data);
  // |config| refers to |this|, so we must release it earlier.
  config.reset();
  if (method != NULL) {
    method->ssl_free(this);
  }
}